

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.c
# Opt level: O0

int OSSL_trace_set_suffix(int category,char *suffix)

{
  char *suffix_local;
  int category_local;
  
  return 0;
}

Assistant:

int OSSL_trace_set_suffix(int category, const char *suffix)
{
#ifndef OPENSSL_NO_TRACE
    if (category >= 0 && category < OSSL_TRACE_CATEGORY_NUM)
        return set_trace_data(category, 0, NULL, NULL, &suffix,
                              trace_attach_cb, trace_detach_cb);
#endif
    return 0;
}